

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O2

void __thiscall
chrono::ChContactContainerNSC::ConstraintsBiLoad_C
          (ChContactContainerNSC *this,double factor,double recovery_clamp,bool do_clamp)

{
  _ConstraintsBiLoad_C<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>>
            (&this->contactlist_6_6,factor,recovery_clamp,do_clamp);
  _ConstraintsBiLoad_C<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<3>>>
            (&this->contactlist_6_3,factor,recovery_clamp,do_clamp);
  _ConstraintsBiLoad_C<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,chrono::ChContactable_1vars<3>>>
            (&this->contactlist_3_3,factor,recovery_clamp,do_clamp);
  _ConstraintsBiLoad_C<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>>
            (&this->contactlist_333_3,factor,recovery_clamp,do_clamp);
  _ConstraintsBiLoad_C<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<6>>>
            (&this->contactlist_333_6,factor,recovery_clamp,do_clamp);
  _ConstraintsBiLoad_C<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_3vars<3,3,3>>>
            (&this->contactlist_333_333,factor,recovery_clamp,do_clamp);
  _ConstraintsBiLoad_C<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<3>>>
            (&this->contactlist_666_3,factor,recovery_clamp,do_clamp);
  _ConstraintsBiLoad_C<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<6>>>
            (&this->contactlist_666_6,factor,recovery_clamp,do_clamp);
  _ConstraintsBiLoad_C<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<3,3,3>>>
            (&this->contactlist_666_333,factor,recovery_clamp,do_clamp);
  _ConstraintsBiLoad_C<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<6,6,6>>>
            (&this->contactlist_666_666,factor,recovery_clamp,do_clamp);
  _ConstraintsBiLoad_C<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>>
            (&this->contactlist_6_6_rolling,factor,recovery_clamp,do_clamp);
  return;
}

Assistant:

void ChContactContainerNSC::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {
    _ConstraintsBiLoad_C(contactlist_6_6, factor, recovery_clamp, do_clamp);
    _ConstraintsBiLoad_C(contactlist_6_3, factor, recovery_clamp, do_clamp);
    _ConstraintsBiLoad_C(contactlist_3_3, factor, recovery_clamp, do_clamp);
    _ConstraintsBiLoad_C(contactlist_333_3, factor, recovery_clamp, do_clamp);
    _ConstraintsBiLoad_C(contactlist_333_6, factor, recovery_clamp, do_clamp);
    _ConstraintsBiLoad_C(contactlist_333_333, factor, recovery_clamp, do_clamp);
    _ConstraintsBiLoad_C(contactlist_666_3, factor, recovery_clamp, do_clamp);
    _ConstraintsBiLoad_C(contactlist_666_6, factor, recovery_clamp, do_clamp);
    _ConstraintsBiLoad_C(contactlist_666_333, factor, recovery_clamp, do_clamp);
    _ConstraintsBiLoad_C(contactlist_666_666, factor, recovery_clamp, do_clamp);
    _ConstraintsBiLoad_C(contactlist_6_6_rolling, factor, recovery_clamp, do_clamp);
}